

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_subset.c
# Opt level: O1

_Bool run_container_is_subset_bitset(run_container_t *container1,bitset_container_t *container2)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  
  iVar4 = container2->cardinality;
  if (iVar4 == -1) {
    iVar4 = bitset_container_compute_cardinality(container2);
  }
  iVar5 = run_container_cardinality(container1);
  if (iVar4 < iVar5) {
    bVar11 = false;
  }
  else {
    uVar6 = (ulong)container1->n_runs;
    bVar11 = (long)uVar6 < 1;
    if (0 < (long)uVar6) {
      uVar7 = 0;
      do {
        uVar2 = container1->runs[uVar7].value;
        if ((container2->words[uVar2 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
          return bVar11;
        }
        uVar3 = container1->runs[uVar7].length;
        uVar9 = (uint)uVar3;
        uVar8 = uVar2 - 1;
        do {
          bVar10 = uVar9 == 0;
          uVar9 = uVar9 - 1;
          if (bVar10) goto LAB_0011c30a;
          uVar1 = uVar8 + 2;
          uVar8 = uVar8 + 1;
        } while ((*(ulong *)((long)container2->words + (ulong)(uVar1 >> 3 & 0x1ff8)) >>
                  ((ulong)uVar1 & 0x3f) & 1) != 0);
        if (uVar8 < (uint)uVar3 + (uint)uVar2) {
          return bVar11;
        }
LAB_0011c30a:
        uVar7 = uVar7 + 1;
        bVar11 = uVar6 <= uVar7;
      } while (uVar7 != uVar6);
    }
  }
  return bVar11;
}

Assistant:

bool run_container_is_subset_bitset(const run_container_t* container1,
                                    const bitset_container_t* container2) {
    // todo: this code could be much faster
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality < run_container_cardinality(container1)) {
            return false;
        }
    } else {
        int32_t card = bitset_container_compute_cardinality(
            container2);  // modify container2?
        if (card < run_container_cardinality(container1)) {
            return false;
        }
    }
    for (int i = 0; i < container1->n_runs; ++i) {
        uint32_t run_start = container1->runs[i].value;
        uint32_t le = container1->runs[i].length;
        for (uint32_t j = run_start; j <= run_start + le; ++j) {
            if (!bitset_container_contains(container2, j)) {
                return false;
            }
        }
    }
    return true;
}